

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StripWhitespace(string *str)

{
  int iVar1;
  char *pcVar2;
  ulong in_RDI;
  int last;
  int first;
  int str_length;
  bool local_16;
  bool local_15;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = std::__cxx11::string::length();
  local_10 = 0;
  while( true ) {
    local_15 = false;
    if (local_10 < local_c) {
      pcVar2 = (char *)std::__cxx11::string::at(in_RDI);
      local_15 = ascii_isspace(*pcVar2);
    }
    if (local_15 == false) break;
    local_10 = local_10 + 1;
  }
  if (local_10 == local_c) {
    std::__cxx11::string::clear();
  }
  else {
    local_14 = local_c;
    if (0 < local_10) {
      std::__cxx11::string::erase(in_RDI,0);
      local_c = local_c - local_10;
      local_14 = local_c;
    }
    do {
      iVar1 = local_14;
      local_14 = iVar1 + -1;
      local_16 = false;
      if (-1 < local_14) {
        pcVar2 = (char *)std::__cxx11::string::at(in_RDI);
        local_16 = ascii_isspace(*pcVar2);
      }
    } while (local_16 != false);
    if ((local_14 != local_c + -1) && (-1 < local_14)) {
      std::__cxx11::string::erase(in_RDI,(long)iVar1);
    }
  }
  return;
}

Assistant:

void StripWhitespace(std::string *str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && ascii_isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && ascii_isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, std::string::npos);
  }
}